

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronPtr xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)

{
  long lVar1;
  xmlElementType xVar2;
  xmlDictPtr dict;
  xmlSchematronPtr pxVar3;
  xmlSchematronRulePtr_conflict pxVar4;
  bool bVar5;
  xmlSchematronPatternPtr_conflict pxVar6;
  int iVar7;
  int iVar8;
  xmlDocPtr doc;
  xmlNodePtr node;
  xmlSchematronPtr schema;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlChar **ppxVar11;
  xmlChar *pxVar12;
  xmlSchematronPatternPtr pxVar13;
  xmlPatternPtr pxVar14;
  xmlSchematronRulePtr_conflict rule;
  xmlSchematronRulePtr_conflict *ppxVar15;
  xmlXPathCompExprPtr pxVar16;
  xmlSchematronLetPtr_conflict pxVar17;
  xmlSchematronTestPtr_conflict pxVar18;
  xmlSchematronRulePtr_conflict pxVar19;
  char *pcVar20;
  xmlSchematronPatternPtr_conflict pxVar21;
  _xmlNode *node_00;
  xmlSchematronTestType type;
  xmlChar *in_R9;
  _xmlNode *cur;
  xmlSchematronRulePtr_conflict prev;
  xmlNode *local_70;
  xmlChar *local_68;
  int local_48;
  
  if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
  ctxt->nberrors = 0;
  if (ctxt->URL == (xmlChar *)0x0) {
    if (ctxt->buffer != (char *)0x0) {
      doc = xmlReadMemory(ctxt->buffer,ctxt->size,(char *)0x0,(char *)0x0,2);
      if (doc == (xmlDocPtr)0x0) {
        iVar7 = 0x6e6;
LAB_0017d9d8:
        pcVar20 = "xmlSchematronParse: could not parse.\n";
        pxVar9 = (xmlChar *)0x0;
LAB_0017d9db:
        xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,iVar7,pcVar20,pxVar9,in_R9);
        return (xmlSchematronPtr)0x0;
      }
      pxVar9 = xmlStrdup((xmlChar *)"in_memory_buffer");
      doc->URL = pxVar9;
      pxVar9 = xmlDictLookup(ctxt->dict,(xmlChar *)"in_memory_buffer",-1);
      ctxt->URL = pxVar9;
      goto LAB_0017d7b0;
    }
    doc = ctxt->doc;
    if (doc == (xmlDocPtr)0x0) {
      iVar7 = 0x6de;
      goto LAB_0017d9d8;
    }
    iVar7 = 1;
    bVar5 = false;
  }
  else {
    doc = xmlReadFile((char *)ctxt->URL,(char *)0x0,2);
    if (doc == (xmlDocPtr)0x0) {
      pxVar9 = ctxt->URL;
      pcVar20 = "xmlSchematronParse: could not load \'%s\'.\n";
      iVar7 = 0x6dd;
      goto LAB_0017d9db;
    }
LAB_0017d7b0:
    iVar7 = 0;
    bVar5 = true;
  }
  ctxt->preserve = iVar7;
  node = xmlDocGetRootElement(doc);
  if (node == (xmlNodePtr)0x0) {
    xmlSchematronPErr(ctxt,(xmlNodePtr)doc,0x6df,"The schema has no document element.\n",
                      (xmlChar *)0x0,in_R9);
    if (bVar5) {
      xmlFreeDoc(doc);
      return (xmlSchematronPtr)0x0;
    }
    return (xmlSchematronPtr)0x0;
  }
  if ((((node->type == XML_ELEMENT_NODE) && (node->ns != (xmlNs *)0x0)) &&
      (iVar7 = xmlStrEqual(node->name,"schema"), iVar7 != 0)) &&
     ((iVar7 = xmlStrEqual(node->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) {
    schema = (xmlSchematronPtr)(*xmlMalloc)(0x60);
    if (schema == (xmlSchematronPtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
      schema = (xmlSchematronPtr)0x0;
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema");
    }
    else {
      schema->nbNamespaces = 0;
      schema->maxNamespaces = 0;
      schema->namespaces = (xmlChar **)0x0;
      schema->patterns = (xmlSchematronPatternPtr_conflict)0x0;
      schema->rules = (xmlSchematronRulePtr_conflict)0x0;
      schema->title = (xmlChar *)0x0;
      schema->nbNs = 0;
      schema->nbPattern = 0;
      schema->_private = (void *)0x0;
      schema->dict = (xmlDictPtr)0x0;
      schema->doc = (xmlDocPtr)0x0;
      *(undefined8 *)&schema->flags = 0;
      schema->name = (xmlChar *)0x0;
      *(undefined8 *)&schema->preserve = 0;
      dict = ctxt->dict;
      schema->dict = dict;
      xmlDictReference(dict);
      ctxt->schema = schema;
      for (cur = node->children; cur != (xmlNode *)0x0; cur = cur->next) {
        if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
           ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
            iVar7 != 0 ||
            (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
            iVar7 != 0)))) {
          if ((((cur->type != XML_ELEMENT_NODE) || (cur->ns == (xmlNs *)0x0)) ||
              (iVar7 = xmlStrEqual(cur->name,(xmlChar *)"title"), iVar7 == 0)) ||
             ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
              iVar7 == 0 &&
              (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
              iVar7 == 0)))) goto LAB_0017db28;
          pxVar9 = xmlNodeGetContent(cur);
          if (pxVar9 != (xmlChar *)0x0) {
            pxVar10 = xmlDictLookup(schema->dict,pxVar9,-1);
            schema->title = pxVar10;
            (*xmlFree)(pxVar9);
          }
          cur = cur->next;
          goto joined_r0x0017dad5;
        }
      }
LAB_0017d8d3:
      if (schema->nbPattern != 0) {
        schema->doc = doc;
        if (!bVar5) {
          schema->preserve = 1;
        }
        goto LAB_0017d923;
      }
      xmlSchematronPErr(ctxt,node,0x6df,"The schematron document \'%s\' has no pattern",ctxt->URL,
                        in_R9);
    }
  }
  else {
    xmlSchematronPErr(ctxt,node,0x6df,"The XML document \'%s\' is not a XML schematron document",
                      ctxt->URL,in_R9);
    schema = (xmlSchematronPtr)0x0;
  }
  if (bVar5) {
    xmlFreeDoc(doc);
  }
  if (schema == (xmlSchematronPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
LAB_0017d923:
  if (ctxt->nberrors != 0) {
    xmlSchematronFree(schema);
    return (xmlSchematronPtr)0x0;
  }
  schema->namespaces = ctxt->namespaces;
  schema->nbNamespaces = ctxt->nbNamespaces;
  ctxt->namespaces = (xmlChar **)0x0;
  return schema;
joined_r0x0017dad5:
  if (cur == (_xmlNode *)0x0) goto LAB_0017d8d3;
  if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
     ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) goto LAB_0017db28;
  cur = cur->next;
  goto joined_r0x0017dad5;
LAB_0017db28:
  xVar2 = cur->type;
  while ((((xVar2 == XML_ELEMENT_NODE && (cur->ns != (xmlNs *)0x0)) &&
          (iVar7 = xmlStrEqual(cur->name,"ns"), iVar7 != 0)) &&
         ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar7 != 0 ||
          (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar7 != 0))))) {
    pxVar9 = xmlGetNoNsProp(cur,"prefix");
    pxVar10 = xmlGetNoNsProp(cur,"uri");
    if ((pxVar10 == (xmlChar *)0x0) || (*pxVar10 == '\0')) {
      xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no uri",(xmlChar *)0x0,in_R9);
    }
    if ((pxVar9 == (xmlChar *)0x0) || (*pxVar9 == '\0')) {
      xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no prefix",(xmlChar *)0x0,in_R9);
    }
    if (pxVar10 == (xmlChar *)0x0 || pxVar9 == (xmlChar *)0x0) {
      if (pxVar10 != (xmlChar *)0x0) goto LAB_0017dd1a;
    }
    else {
      xmlXPathRegisterNs(ctxt->xctxt,pxVar9,pxVar10);
      if (ctxt->namespaces == (xmlChar **)0x0) {
        ctxt->maxNamespaces = 10;
        ppxVar11 = (xmlChar **)(*xmlMalloc)(0xa0);
        ctxt->namespaces = ppxVar11;
        if (ppxVar11 != (xmlChar **)0x0) {
          ctxt->nbNamespaces = 0;
          goto LAB_0017dc8b;
        }
LAB_0017dcfc:
        __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating parser namespaces");
      }
      else {
        if (ctxt->maxNamespaces <= ctxt->nbNamespaces + 2) {
          ppxVar11 = (xmlChar **)(*xmlRealloc)(ctxt->namespaces,(long)ctxt->maxNamespaces << 5);
          if (ppxVar11 == (xmlChar **)0x0) goto LAB_0017dcfc;
          ctxt->namespaces = ppxVar11;
          ctxt->maxNamespaces = ctxt->maxNamespaces << 1;
        }
LAB_0017dc8b:
        pxVar12 = xmlDictLookup(ctxt->dict,pxVar10,-1);
        ctxt->namespaces[(long)ctxt->nbNamespaces * 2] = pxVar12;
        pxVar12 = xmlDictLookup(ctxt->dict,pxVar9,-1);
        iVar7 = ctxt->nbNamespaces;
        lVar1 = (long)iVar7 + 1;
        ctxt->namespaces[(long)iVar7 * 2 + 1] = pxVar12;
        ctxt->nbNamespaces = (int)lVar1;
        ctxt->namespaces[lVar1 * 2] = (xmlChar *)0x0;
        ctxt->namespaces[iVar7 * 2 + 3] = (xmlChar *)0x0;
      }
      schema->nbNs = schema->nbNs + 1;
LAB_0017dd1a:
      (*xmlFree)(pxVar10);
    }
    if (pxVar9 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar9);
    }
    cur = cur->next;
    while( true ) {
      if (cur == (_xmlNode *)0x0) goto LAB_0017d8d3;
      if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
         ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar7 != 0 ||
          (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar7 != 0)))) break;
      cur = cur->next;
    }
    xVar2 = cur->type;
  }
  do {
    if ((((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
        (iVar7 = xmlStrEqual(cur->name,"pattern"), iVar7 != 0)) &&
       ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
        iVar7 != 0 ||
        (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
        iVar7 != 0)))) {
      pxVar9 = xmlGetNoNsProp(cur,"id");
      if (pxVar9 == (xmlChar *)0x0) {
        pxVar9 = xmlGetNoNsProp(cur,"name");
      }
      pxVar3 = ctxt->schema;
      if (pxVar9 == (xmlChar *)0x0 || pxVar3 == (xmlSchematronPtr)0x0) {
        if (pxVar9 != (xmlChar *)0x0) {
LAB_0017df1f:
          (*xmlFree)(pxVar9);
        }
      }
      else {
        pxVar13 = (xmlSchematronPatternPtr)(*xmlMalloc)(0x18);
        if (pxVar13 == (xmlSchematronPatternPtr)0x0) {
          ctxt->nberrors = ctxt->nberrors + 1;
          __xmlSimpleError(0x10,2,cur,(char *)0x0,"allocating schema pattern");
          goto LAB_0017df1f;
        }
        pxVar13->name = pxVar9;
        pxVar13->next = (xmlSchematronPatternPtr)0x0;
        pxVar13->rules = (xmlSchematronRulePtr_conflict)0x0;
        pxVar6 = pxVar3->patterns;
        if (pxVar3->patterns == (xmlSchematronPatternPtr_conflict)0x0) {
          pxVar21 = (xmlSchematronPatternPtr_conflict)&pxVar3->patterns;
        }
        else {
          do {
            pxVar21 = pxVar6;
            pxVar6 = pxVar21->next;
          } while (pxVar21->next != (xmlSchematronPatternPtr)0x0);
        }
        pxVar21->next = pxVar13;
        node_00 = cur->children;
        if (node_00 != (xmlNode *)0x0) {
          do {
            if (((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
               ((iVar7 = xmlStrEqual(node_00->ns->href,
                                     (xmlChar *)"http://purl.oclc.org/dsdl/schematron"), iVar7 != 0
                || (iVar7 = xmlStrEqual(node_00->ns->href,
                                        (xmlChar *)"http://www.ascc.net/xml/schematron"), iVar7 != 0
                   )))) {
              local_48 = 0;
              goto LAB_0017dfbc;
            }
            node_00 = node_00->next;
          } while (node_00 != (_xmlNode *)0x0);
        }
LAB_0017df8a:
        xmlSchematronPErr(ctxt,cur,0x6df,"Pattern has no rule element",(xmlChar *)0x0,in_R9);
      }
LAB_0017dfa4:
      schema->nbPattern = schema->nbPattern + 1;
    }
    else {
      xmlSchematronPErr(ctxt,cur,0x6df,"Expecting a pattern element instead of %s",cur->name,in_R9);
    }
    do {
      cur = cur->next;
      if (cur == (_xmlNode *)0x0) goto LAB_0017d8d3;
    } while (((cur->type != XML_ELEMENT_NODE) || (cur->ns == (xmlNs *)0x0)) ||
            ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
             iVar7 == 0 &&
             (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
             iVar7 == 0))));
  } while( true );
LAB_0017dfbc:
  if ((((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
      (iVar7 = xmlStrEqual(node_00->name,"rule"), iVar7 != 0)) &&
     ((iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) {
    pxVar9 = xmlGetNoNsProp(node_00,"context");
    if (pxVar9 == (xmlChar *)0x0) {
      pcVar20 = "rule has no context attribute";
      local_70 = node_00;
LAB_0017e649:
      local_68 = (xmlChar *)0x0;
LAB_0017e64c:
      xmlSchematronPErr(ctxt,local_70,0x6df,pcVar20,local_68,in_R9);
    }
    else {
      if (*pxVar9 == '\0') {
        xmlSchematronPErr(ctxt,node_00,0x6df,"rule has an empty context attribute",(xmlChar *)0x0,
                          in_R9);
      }
      else {
        pxVar3 = ctxt->schema;
        if (pxVar3 != (xmlSchematronPtr)0x0) {
          pxVar14 = xmlPatterncompile(pxVar9,ctxt->dict,1,ctxt->namespaces);
          if (pxVar14 == (xmlPatternPtr)0x0) {
            xmlSchematronPErr(ctxt,node_00,0x6df,"Failed to compile context expression %s",pxVar9,
                              in_R9);
          }
          rule = (xmlSchematronRulePtr_conflict)(*xmlMalloc)(0x40);
          if (rule != (xmlSchematronRulePtr_conflict)0x0) {
            rule->patnext = (xmlSchematronRulePtr)0x0;
            rule->node = (xmlNodePtr)0x0;
            rule->context = (xmlChar *)0x0;
            rule->tests = (xmlSchematronTestPtr_conflict)0x0;
            rule->node = node_00;
            rule->context = pxVar9;
            rule->pattern = pxVar14;
            rule->next = (xmlSchematronRulePtr)0x0;
            rule->report = (xmlChar *)0x0;
            rule->lets = (xmlSchematronLetPtr_conflict)0x0;
            pxVar4 = pxVar3->rules;
            if (pxVar3->rules == (xmlSchematronRulePtr_conflict)0x0) {
              local_70 = (xmlNode *)&pxVar3->rules;
            }
            else {
              do {
                local_70 = (xmlNode *)pxVar4;
                pxVar4 = ((xmlSchematronRulePtr_conflict)local_70)->next;
              } while (((xmlSchematronRulePtr_conflict)local_70)->next != (xmlSchematronRulePtr)0x0)
              ;
            }
            local_70->_private = rule;
            rule->patnext = (xmlSchematronRulePtr)0x0;
            pxVar4 = pxVar13->rules;
            ppxVar15 = &pxVar13->rules;
            if (pxVar4 != (xmlSchematronRulePtr_conflict)0x0) {
              do {
                pxVar19 = pxVar4;
                pxVar4 = pxVar19->patnext;
              } while (pxVar4 != (xmlSchematronRulePtr)0x0);
              ppxVar15 = &pxVar19->patnext;
            }
            *ppxVar15 = rule;
            for (local_70 = node_00->children; local_70 != (_xmlNode *)0x0;
                local_70 = local_70->next) {
              if (((local_70->type == XML_ELEMENT_NODE) && (local_70->ns != (xmlNs *)0x0)) &&
                 ((iVar7 = xmlStrEqual(local_70->ns->href,
                                       (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                  iVar7 != 0 ||
                  (iVar7 = xmlStrEqual(local_70->ns->href,
                                       (xmlChar *)"http://www.ascc.net/xml/schematron"), iVar7 != 0)
                  ))) {
                iVar7 = 0;
                goto LAB_0017e287;
              }
            }
LAB_0017e637:
            pcVar20 = "rule has no assert nor report element";
            local_70 = node_00;
            goto LAB_0017e649;
          }
          ctxt->nberrors = ctxt->nberrors + 1;
          __xmlSimpleError(0x10,2,node_00,(char *)0x0,"allocating schema rule");
        }
      }
LAB_0017e1ca:
      (*xmlFree)(pxVar9);
    }
LAB_0017e651:
    local_48 = local_48 + 1;
  }
  else {
    xmlSchematronPErr(ctxt,node_00,0x6df,"Expecting a rule element instead of %s",node_00->name,
                      in_R9);
  }
  do {
    node_00 = node_00->next;
    if (node_00 == (_xmlNode *)0x0) {
      if (local_48 != 0) goto LAB_0017dfa4;
      goto LAB_0017df8a;
    }
  } while (((node_00->type != XML_ELEMENT_NODE) || (node_00->ns == (xmlNs *)0x0)) ||
          ((iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron")
           , iVar7 == 0 &&
           (iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar7 == 0))));
  goto LAB_0017dfbc;
LAB_0017e287:
  if (local_70->type == XML_ELEMENT_NODE) {
    if (((local_70->ns != (xmlNs *)0x0) && (iVar8 = xmlStrEqual(local_70->name,"let"), iVar8 != 0))
       && ((iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"
                               ), iVar8 != 0 ||
           (iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar8 != 0)))) {
      pxVar9 = xmlGetNoNsProp(local_70,"name");
      if (pxVar9 != (xmlChar *)0x0) {
        if (*pxVar9 != '\0') {
          local_68 = xmlGetNoNsProp(local_70,"value");
          if (local_68 != (xmlChar *)0x0) {
            if (*local_68 != '\0') {
              pxVar16 = xmlXPathCtxtCompile(ctxt->xctxt,local_68);
              if (pxVar16 != (xmlXPathCompExprPtr)0x0) {
                pxVar17 = (xmlSchematronLetPtr_conflict)malloc(0x18);
                pxVar17->name = pxVar9;
                pxVar17->comp = pxVar16;
                pxVar17->next = rule->lets;
                rule->lets = pxVar17;
                goto LAB_0017e3a3;
              }
              pcVar20 = "Failed to compile let expression %s";
              goto LAB_0017e64c;
            }
            xmlSchematronPErr(ctxt,local_70,0x6df,"let has an empty value attribute",(xmlChar *)0x0,
                              in_R9);
            pxVar9 = local_68;
            goto LAB_0017e1ca;
          }
          pcVar20 = "let has no value attribute";
          goto LAB_0017e649;
        }
        xmlSchematronPErr(ctxt,local_70,0x6df,"let has an empty name attribute",(xmlChar *)0x0,in_R9
                         );
        goto LAB_0017e1ca;
      }
      pcVar20 = "let has no name attribute";
      goto LAB_0017e649;
    }
    if ((local_70->type != XML_ELEMENT_NODE) || (local_70->ns == (xmlNs *)0x0)) goto LAB_0017e56c;
    iVar8 = xmlStrEqual(local_70->name,"assert");
    if ((iVar8 == 0) ||
       ((iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
        iVar8 == 0 &&
        (iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
        iVar8 == 0)))) {
      if ((local_70->type != XML_ELEMENT_NODE) ||
         (((local_70->ns == (xmlNs *)0x0 ||
           (iVar8 = xmlStrEqual(local_70->name,"report"), iVar8 == 0)) ||
          ((iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"
                               ), iVar8 == 0 &&
           (iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar8 == 0)))))) goto LAB_0017e56c;
      local_68 = xmlGetNoNsProp(local_70,"test");
      if (local_68 != (xmlChar *)0x0) {
        if (*local_68 == '\0') goto LAB_0017e60f;
        xmlSchematronParseTestReportMsg(ctxt,local_70);
        in_R9 = xmlNodeGetContent(local_70);
        type = XML_SCHEMATRON_REPORT;
        goto LAB_0017e47c;
      }
LAB_0017e5f3:
      iVar7 = iVar7 + 1;
      pcVar20 = "assert has no test attribute";
      pxVar9 = (xmlChar *)0x0;
      goto LAB_0017e584;
    }
    local_68 = xmlGetNoNsProp(local_70,"test");
    if (local_68 == (xmlChar *)0x0) goto LAB_0017e5f3;
    if (*local_68 == '\0') {
LAB_0017e60f:
      iVar7 = iVar7 + 1;
      xmlSchematronPErr(ctxt,local_70,0x6df,"assert has an empty test attribute",(xmlChar *)0x0,
                        in_R9);
LAB_0017e3a3:
      (*xmlFree)(local_68);
    }
    else {
      xmlSchematronParseTestReportMsg(ctxt,local_70);
      in_R9 = xmlNodeGetContent(local_70);
      type = XML_SCHEMATRON_ASSERT;
LAB_0017e47c:
      iVar7 = iVar7 + 1;
      pxVar18 = xmlSchematronAddTest(ctxt,type,rule,local_70,local_68,in_R9);
      if (pxVar18 == (xmlSchematronTestPtr_conflict)0x0) goto LAB_0017e3a3;
    }
  }
  else {
LAB_0017e56c:
    pxVar9 = local_70->name;
    pcVar20 = "Expecting an assert or a report element instead of %s";
LAB_0017e584:
    xmlSchematronPErr(ctxt,local_70,0x6df,pcVar20,pxVar9,in_R9);
  }
  do {
    local_70 = local_70->next;
    if (local_70 == (_xmlNode *)0x0) {
      if (iVar7 == 0) goto LAB_0017e637;
      goto LAB_0017e651;
    }
  } while (((local_70->type != XML_ELEMENT_NODE) || (local_70->ns == (xmlNs *)0x0)) ||
          ((iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"
                               ), iVar8 == 0 &&
           (iVar8 = xmlStrEqual(local_70->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar8 == 0))));
  goto LAB_0017e287;
}

Assistant:

xmlSchematronPtr
xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)
{
    xmlSchematronPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root, cur;
    int preserve = 0;

    if (ctxt == NULL)
        return (NULL);

    ctxt->nberrors = 0;

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlReadFile((const char *) ctxt->URL, NULL,
                          SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
            xmlSchematronPErr(ctxt, NULL,
                          XML_SCHEMAP_FAILED_LOAD,
                          "xmlSchematronParse: could not load '%s'.\n",
                          ctxt->URL, NULL);
            return (NULL);
        }
        ctxt->preserve = 0;
    } else if (ctxt->buffer != NULL) {
        doc = xmlReadMemory(ctxt->buffer, ctxt->size, NULL, NULL,
                            SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
            xmlSchematronPErr(ctxt, NULL,
                          XML_SCHEMAP_FAILED_PARSE,
                          "xmlSchematronParse: could not parse.\n",
                          NULL, NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlDictLookup(ctxt->dict, BAD_CAST "in_memory_buffer", -1);
        ctxt->preserve = 0;
    } else if (ctxt->doc != NULL) {
        doc = ctxt->doc;
        preserve = 1;
        ctxt->preserve = 1;
    } else {
        xmlSchematronPErr(ctxt, NULL,
                      XML_SCHEMAP_NOTHING_TO_PARSE,
                      "xmlSchematronParse: could not parse.\n",
                      NULL, NULL);
        return (NULL);
    }

    /*
     * Then extract the root and Schematron parse it
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
        xmlSchematronPErr(ctxt, (xmlNodePtr) doc,
                      XML_SCHEMAP_NOROOT,
                      "The schema has no document element.\n", NULL, NULL);
        if (!preserve) {
            xmlFreeDoc(doc);
        }
        return (NULL);
    }

    if (!IS_SCHEMATRON(root, "schema")) {
        xmlSchematronPErr(ctxt, root,
            XML_SCHEMAP_NOROOT,
            "The XML document '%s' is not a XML schematron document",
            ctxt->URL, NULL);
        goto exit;
    }
    ret = xmlSchematronNewSchematron(ctxt);
    if (ret == NULL)
        goto exit;
    ctxt->schema = ret;

    /*
     * scan the schema elements
     */
    cur = root->children;
    NEXT_SCHEMATRON(cur);
    if (IS_SCHEMATRON(cur, "title")) {
        xmlChar *title = xmlNodeGetContent(cur);
        if (title != NULL) {
            ret->title = xmlDictLookup(ret->dict, title, -1);
            xmlFree(title);
        }
        cur = cur->next;
        NEXT_SCHEMATRON(cur);
    }
    while (IS_SCHEMATRON(cur, "ns")) {
        xmlChar *prefix = xmlGetNoNsProp(cur, BAD_CAST "prefix");
        xmlChar *uri = xmlGetNoNsProp(cur, BAD_CAST "uri");
        if ((uri == NULL) || (uri[0] == 0)) {
            xmlSchematronPErr(ctxt, cur,
                XML_SCHEMAP_NOROOT,
                "ns element has no uri", NULL, NULL);
        }
        if ((prefix == NULL) || (prefix[0] == 0)) {
            xmlSchematronPErr(ctxt, cur,
                XML_SCHEMAP_NOROOT,
                "ns element has no prefix", NULL, NULL);
        }
        if ((prefix) && (uri)) {
            xmlXPathRegisterNs(ctxt->xctxt, prefix, uri);
            xmlSchematronAddNamespace(ctxt, prefix, uri);
            ret->nbNs++;
        }
        if (uri)
            xmlFree(uri);
        if (prefix)
            xmlFree(prefix);
        cur = cur->next;
        NEXT_SCHEMATRON(cur);
    }
    while (cur != NULL) {
        if (IS_SCHEMATRON(cur, "pattern")) {
            xmlSchematronParsePattern(ctxt, cur);
            ret->nbPattern++;
        } else {
            xmlSchematronPErr(ctxt, cur,
                XML_SCHEMAP_NOROOT,
                "Expecting a pattern element instead of %s", cur->name, NULL);
        }
        cur = cur->next;
        NEXT_SCHEMATRON(cur);
    }
    if (ret->nbPattern == 0) {
        xmlSchematronPErr(ctxt, root,
            XML_SCHEMAP_NOROOT,
            "The schematron document '%s' has no pattern",
            ctxt->URL, NULL);
        goto exit;
    }
    /* the original document must be kept for reporting */
    ret->doc = doc;
    if (preserve) {
            ret->preserve = 1;
    }
    preserve = 1;

exit:
    if (!preserve) {
        xmlFreeDoc(doc);
    }
    if (ret != NULL) {
        if (ctxt->nberrors != 0) {
            xmlSchematronFree(ret);
            ret = NULL;
        } else {
            ret->namespaces = ctxt->namespaces;
            ret->nbNamespaces = ctxt->nbNamespaces;
            ctxt->namespaces = NULL;
        }
    }
    return (ret);
}